

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAM.cpp
# Opt level: O1

void __thiscall OpenMD::EAM::initialize(EAM *this)

{
  pointer pcVar1;
  pointer piVar2;
  vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_> *pvVar3;
  vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_> *pvVar4;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  _Rb_tree_node_base *p_Var8;
  AtomType *this_00;
  AtomType *this_01;
  long lVar9;
  _Base_ptr p_Var10;
  vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_> *this_02;
  _Rb_tree_header *p_Var11;
  NonBondedInteractionType *this_03;
  vector<double,_std::allocator<double>_> phiAB;
  string EAMMixMeth;
  undefined1 local_d8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  pointer local_a8;
  _Rb_tree_node_base *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_78 [32];
  RealType local_58;
  _Base_ptr local_50;
  vector<double,_std::allocator<double>_> local_48;
  
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  pcVar1 = (this->forceField_->forceFieldOptions_).EAMMixingMethod.data_._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar1,
             pcVar1 + (this->forceField_->forceFieldOptions_).EAMMixingMethod.data_._M_string_length
            );
  std::locale::locale((locale *)local_d8);
  toUpper<std::__cxx11::string>(&local_98,(locale *)local_d8);
  std::locale::~locale((locale *)local_d8);
  iVar7 = std::__cxx11::string::compare((char *)&local_98);
  if (iVar7 == 0) {
    this->mixMeth_ = eamJohnson;
  }
  else {
    iVar7 = std::__cxx11::string::compare((char *)&local_98);
    if (iVar7 == 0) {
      this->mixMeth_ = eamDream1;
    }
    else {
      iVar7 = std::__cxx11::string::compare((char *)&local_98);
      if (iVar7 == 0) {
        this->mixMeth_ = eamDream2;
      }
      else {
        iVar7 = std::__cxx11::string::compare((char *)&local_98);
        if (iVar7 == 0) {
          this->mixMeth_ = eamDaw;
        }
        else {
          this->mixMeth_ = eamUnknownMix;
        }
      }
    }
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&(this->EAMtypes)._M_t);
  piVar2 = (this->EAMtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->EAMtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar2) {
    (this->EAMtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar2;
  }
  std::vector<OpenMD::EAMAtomData,_std::allocator<OpenMD::EAMAtomData>_>::_M_erase_at_end
            (&this->EAMdata,
             (this->EAMdata).
             super__Vector_base<OpenMD::EAMAtomData,_std::allocator<OpenMD::EAMAtomData>_>._M_impl.
             super__Vector_impl_data._M_start);
  pvVar3 = (this->MixingMap).
           super__Vector_base<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar4 = (this->MixingMap).
           super__Vector_base<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_02 = pvVar3;
  if (pvVar4 != pvVar3) {
    do {
      std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>::~vector
                (this_02);
      this_02 = this_02 + 1;
    } while (this_02 != pvVar4);
    (this->MixingMap).
    super__Vector_base<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pvVar3;
  }
  this->nEAM_ = 0;
  local_d8._0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::resize
            (&this->EAMtids,
             (this->forceField_->atomTypeCont_).data_._M_t._M_impl.super__Rb_tree_header.
             _M_node_count,(value_type_conflict2 *)local_d8);
  p_Var11 = &(this->simTypes_)._M_t._M_impl.super__Rb_tree_header;
  for (p_Var8 = (this->simTypes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var8 != p_Var11;
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
    bVar6 = AtomType::isEAM(*(AtomType **)(p_Var8 + 1));
    if (bVar6) {
      this->nEAM_ = this->nEAM_ + 1;
    }
  }
  std::vector<OpenMD::EAMAtomData,_std::allocator<OpenMD::EAMAtomData>_>::resize
            (&this->EAMdata,(long)this->nEAM_);
  std::
  vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
  ::resize(&this->MixingMap,(long)this->nEAM_);
  for (p_Var8 = (this->simTypes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var8 != p_Var11;
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
    bVar6 = AtomType::isEAM(*(AtomType **)(p_Var8 + 1));
    if (bVar6) {
      addType(this,*(AtomType **)(p_Var8 + 1));
    }
  }
  local_b8._M_allocated_capacity = 0;
  local_b8._8_8_ = (pointer)0x0;
  local_a8 = (pointer)0x0;
  p_Var10 = (this->forceField_->nonBondedInteractionTypeCont_).data_._M_t._M_impl.
            super__Rb_tree_header._M_header._M_left;
  local_50 = &(this->forceField_->nonBondedInteractionTypeCont_).data_._M_t._M_impl.
              super__Rb_tree_header._M_header;
  if (p_Var10 == local_50) {
    this_03 = (NonBondedInteractionType *)0x0;
  }
  else {
    this_03 = *(NonBondedInteractionType **)(p_Var10 + 2);
  }
  if (this_03 != (NonBondedInteractionType *)0x0) {
    do {
      local_a0 = p_Var10;
      bVar6 = NonBondedInteractionType::isEAMTable(this_03);
      if (((bVar6) || (bVar6 = NonBondedInteractionType::isEAMZhou(this_03), bVar6)) ||
         (bVar6 = NonBondedInteractionType::isEAMOxides(this_03), bVar6)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_78,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_a0 + 1));
        local_d8._16_8_ = local_a8;
        local_d8._8_8_ = local_b8._8_8_;
        local_d8._0_8_ = local_b8._M_allocated_capacity;
        local_b8._M_allocated_capacity = local_78._0_8_;
        local_b8._8_8_ = local_78._8_8_;
        local_a8 = (pointer)local_78._16_8_;
        local_78._0_8_ = (string *)0x0;
        local_78._8_8_ = (pointer)0x0;
        local_78._16_8_ = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_d8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_78);
        this_00 = ForceField::getAtomType
                            (this->forceField_,(string *)local_b8._M_allocated_capacity);
        if (this_00 == (AtomType *)0x0) {
          snprintf(painCave.errMsg,2000,
                   "EAM::initialize could not find AtomType %s\n\tfor %s - %s explicit interaction.\n"
                   ,*(undefined8 *)local_b8._M_allocated_capacity,
                   *(undefined8 *)local_b8._M_allocated_capacity,
                   (((string *)(local_b8._M_allocated_capacity + 0x20))->_M_dataplus)._M_p);
          painCave.isFatal = 1;
          painCave.severity = 1;
          simError();
        }
        this_01 = ForceField::getAtomType
                            (this->forceField_,(string *)(local_b8._M_allocated_capacity + 0x20));
        if (this_01 == (AtomType *)0x0) {
          pcVar1 = (((string *)(local_b8._M_allocated_capacity + 0x20))->_M_dataplus)._M_p;
          snprintf(painCave.errMsg,2000,
                   "EAM::initialize could not find AtomType %s\n\tfor %s - %s explicit interaction.\n"
                   ,pcVar1,*(undefined8 *)local_b8._M_allocated_capacity,pcVar1);
          painCave.isFatal = 1;
          painCave.severity = 1;
          simError();
        }
        lVar9 = __dynamic_cast(this_03,&NonBondedInteractionType::typeinfo,
                               &EAMInteractionType::typeinfo,0);
        if (lVar9 == 0) {
          AtomType::getName_abi_cxx11_((string *)local_d8,this_00);
          uVar5 = local_d8._0_8_;
          AtomType::getName_abi_cxx11_((string *)local_78,this_01);
          snprintf(painCave.errMsg,2000,
                   "EAM::initialize could not convert NonBondedInteractionType\n\tto EAMInteractionType for %s - %s interaction.\n"
                   ,uVar5,local_78._0_8_);
          if ((string *)local_78._0_8_ != (string *)(local_78 + 0x10)) {
            operator_delete((void *)local_78._0_8_,(ulong)(local_78._16_8_ + 1));
          }
          if ((string *)local_d8._0_8_ != (string *)(local_d8 + 0x10)) {
            operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
          }
          painCave.isFatal = 1;
          painCave.severity = 1;
          simError();
        }
        bVar6 = NonBondedInteractionType::isEAMTable(this_03);
        if (bVar6) {
          std::vector<double,_std::allocator<double>_>::vector
                    ((vector<double,_std::allocator<double>_> *)local_d8,
                     (vector<double,_std::allocator<double>_> *)(lVar9 + 0x78));
          local_58 = *(RealType *)(lVar9 + 0x68);
          iVar7 = *(int *)(lVar9 + 0x60);
          std::vector<double,_std::allocator<double>_>::vector
                    (&local_48,(vector<double,_std::allocator<double>_> *)local_d8);
          addExplicitInteraction(this,this_00,this_01,local_58,iVar7,&local_48);
          if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_48.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_48.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if ((string *)local_d8._0_8_ != (string *)0x0) {
            operator_delete((void *)local_d8._0_8_,local_d8._16_8_ - local_d8._0_8_);
          }
        }
        else {
          bVar6 = NonBondedInteractionType::isEAMZhou(this_03);
          if (bVar6) {
            addExplicitInteraction
                      (this,this_00,this_01,*(RealType *)(lVar9 + 0x90),*(RealType *)(lVar9 + 0x98),
                       *(RealType *)(lVar9 + 0xa0),*(RealType *)(lVar9 + 0xa8),
                       *(RealType *)(lVar9 + 0xb0),*(RealType *)(lVar9 + 0xb8),
                       *(RealType *)(lVar9 + 0xc0));
          }
          else {
            bVar6 = NonBondedInteractionType::isEAMOxides(this_03);
            if (bVar6) {
              addExplicitInteraction
                        (this,this_00,this_01,*(RealType *)(lVar9 + 0x90),
                         *(RealType *)(lVar9 + 0x98),*(RealType *)(lVar9 + 0xa8),
                         *(RealType *)(lVar9 + 200),*(RealType *)(lVar9 + 0xd0));
            }
          }
        }
      }
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(local_a0);
      if (p_Var10 == local_50) {
        this_03 = (NonBondedInteractionType *)0x0;
      }
      else {
        this_03 = *(NonBondedInteractionType **)(p_Var10 + 2);
      }
    } while (this_03 != (NonBondedInteractionType *)0x0);
  }
  this->initialized_ = true;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void EAM::initialize() {
    // set up the mixing method:
    ForceFieldOptions& fopts = forceField_->getForceFieldOptions();
    string EAMMixMeth        = fopts.getEAMMixingMethod();
    toUpper(EAMMixMeth);
    if (EAMMixMeth == "JOHNSON")
      mixMeth_ = eamJohnson;
    else if (EAMMixMeth == "DREAM1")
      mixMeth_ = eamDream1;
    else if (EAMMixMeth == "DREAM2")
      mixMeth_ = eamDream2;
    else if (EAMMixMeth == "DAW")
      mixMeth_ = eamDaw;
    else
      mixMeth_ = eamUnknownMix;

    // find all of the EAM atom Types:
    EAMtypes.clear();
    EAMtids.clear();
    EAMdata.clear();
    MixingMap.clear();
    nEAM_ = 0;

    EAMtids.resize(forceField_->getNAtomType(), -1);

    AtomTypeSet::iterator at;
    for (at = simTypes_.begin(); at != simTypes_.end(); ++at) {
      if ((*at)->isEAM()) nEAM_++;
    }
    EAMdata.resize(nEAM_);
    MixingMap.resize(nEAM_);

    for (at = simTypes_.begin(); at != simTypes_.end(); ++at) {
      if ((*at)->isEAM()) addType(*at);
    }

    // find all of the explicit EAM interactions:
    ForceField::NonBondedInteractionTypeContainer* nbiTypes =
        forceField_->getNonBondedInteractionTypes();
    ForceField::NonBondedInteractionTypeContainer::MapTypeIterator j;
    ForceField::NonBondedInteractionTypeContainer::KeyType keys;
    NonBondedInteractionType* nbt;

    for (nbt = nbiTypes->beginType(j); nbt != NULL;
         nbt = nbiTypes->nextType(j)) {
      if (nbt->isEAMTable() || nbt->isEAMZhou() || nbt->isEAMOxides()) {
        keys          = nbiTypes->getKeys(j);
        AtomType* at1 = forceField_->getAtomType(keys[0]);
        if (at1 == NULL) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "EAM::initialize could not find AtomType %s\n"
                   "\tfor %s - %s explicit interaction.\n",
                   keys[0].c_str(), keys[0].c_str(), keys[1].c_str());
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }

        AtomType* at2 = forceField_->getAtomType(keys[1]);
        if (at2 == NULL) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "EAM::initialize could not find AtomType %s\n"
                   "\tfor %s - %s explicit interaction.\n",
                   keys[1].c_str(), keys[0].c_str(), keys[1].c_str());
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }

        EAMInteractionType* eamit = dynamic_cast<EAMInteractionType*>(nbt);

        if (eamit == NULL) {
          snprintf(
              painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
              "EAM::initialize could not convert NonBondedInteractionType\n"
              "\tto EAMInteractionType for %s - %s interaction.\n",
              at1->getName().c_str(), at2->getName().c_str());
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }
        if (nbt->isEAMTable()) {
          vector<RealType> phiAB = eamit->getPhi();
          RealType dr            = eamit->getDr();
          int nr                 = eamit->getNr();

          addExplicitInteraction(at1, at2, dr, nr, phiAB);

        } else if (nbt->isEAMZhou()) {
          RealType re     = eamit->getRe();
          RealType alpha  = eamit->getAlpha();
          RealType beta   = eamit->getBeta();
          RealType A      = eamit->getA();
          RealType B      = eamit->getB();
          RealType kappa  = eamit->getKappa();
          RealType lambda = eamit->getLambda();

          addExplicitInteraction(at1, at2, re, alpha, beta, A, B, kappa,
                                 lambda);

        } else if (nbt->isEAMOxides()) {
          RealType re    = eamit->getRe();
          RealType alpha = eamit->getAlpha();
          RealType A     = eamit->getA();
          RealType Ci    = eamit->getCi();
          RealType Cj    = eamit->getCj();
          addExplicitInteraction(at1, at2, re, alpha, A, Ci, Cj);
        }
      }
    }
    initialized_ = true;
  }